

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_dep_parser.cc
# Opt level: O0

void DepParserTask::get_gold_actions
               (search *sch,uint32_t idx,uint64_t param_3,v_array<unsigned_int> *gold_actions)

{
  uint uVar1;
  v_array<unsigned_int> valid_actions_00;
  v_array<unsigned_int> valid_actions_01;
  v_array<unsigned_int> valid_actions_02;
  v_array<unsigned_int> valid_actions_03;
  bool bVar2;
  task_data *ptVar3;
  v_array<unsigned_int> *this;
  v_array<unsigned_int> *pvVar4;
  size_t sVar5;
  ulong i_00;
  uint32_t *puVar6;
  uint *puVar7;
  uint *puVar8;
  uint in_ESI;
  search *in_RDI;
  uint32_t i;
  size_t count;
  size_t best_action;
  uint32_t *sys;
  size_t last;
  size_t size;
  v_array<unsigned_int> *valid_actions;
  v_array<unsigned_int> *gold_heads;
  v_array<unsigned_int> *stack;
  v_array<unsigned_int> *action_loss;
  task_data *data;
  v_array<unsigned_int> *in_stack_fffffffffffffee0;
  v_array<unsigned_int> *this_00;
  v_array<unsigned_int> *pvVar9;
  undefined4 in_stack_ffffffffffffff00;
  uint uVar10;
  uint uVar11;
  uint *in_stack_ffffffffffffff08;
  v_array<unsigned_int> *in_stack_ffffffffffffff10;
  uint *in_stack_ffffffffffffff18;
  uint local_b4;
  size_t local_a8;
  
  ptVar3 = Search::search::get_task_data<task_data>(in_RDI);
  this = &ptVar3->action_loss;
  pvVar9 = &ptVar3->stack;
  pvVar4 = &ptVar3->valid_actions;
  v_array<unsigned_int>::clear(in_stack_fffffffffffffee0);
  sVar5 = v_array<unsigned_int>::size(pvVar9);
  if (sVar5 == 0) {
    uVar11 = 0;
  }
  else {
    uVar11 = v_array<unsigned_int>::last(pvVar9);
  }
  i_00 = (ulong)uVar11;
  puVar6 = &ptVar3->transition_system;
  if (*puVar6 == 1) {
    puVar8 = pvVar4->_begin;
    this_00 = (v_array<unsigned_int> *)(ptVar3->valid_actions)._end;
    valid_actions_00._begin._4_4_ = uVar11;
    valid_actions_00._begin._0_4_ = in_stack_ffffffffffffff00;
    valid_actions_00._end = in_stack_ffffffffffffff08;
    valid_actions_00.end_array = (uint *)in_stack_ffffffffffffff10;
    valid_actions_00.erase_count = (size_t)in_stack_ffffffffffffff18;
    bVar2 = is_valid((uint64_t)(ptVar3->valid_actions).end_array,valid_actions_00);
    if ((bVar2) &&
       ((bVar2 = v_array<unsigned_int>::empty(pvVar9), bVar2 ||
        (puVar7 = v_array<unsigned_int>::operator[](&ptVar3->gold_heads,(ulong)in_ESI),
        *puVar7 == i_00)))) {
      v_array<unsigned_int>::push_back(this_00,puVar8);
      return;
    }
  }
  if (*puVar6 == 1) {
    puVar8 = pvVar4->_begin;
    pvVar9 = (v_array<unsigned_int> *)(ptVar3->valid_actions)._end;
    valid_actions_01._begin._4_4_ = uVar11;
    valid_actions_01._begin._0_4_ = in_stack_ffffffffffffff00;
    valid_actions_01._end = in_stack_ffffffffffffff08;
    valid_actions_01.end_array = (uint *)in_stack_ffffffffffffff10;
    valid_actions_01.erase_count = (size_t)in_stack_ffffffffffffff18;
    bVar2 = is_valid((uint64_t)(ptVar3->valid_actions).end_array,valid_actions_01);
    if ((bVar2) &&
       (puVar7 = v_array<unsigned_int>::operator[](&ptVar3->gold_heads,i_00), *puVar7 == in_ESI)) {
      v_array<unsigned_int>::push_back(pvVar9,puVar8);
      return;
    }
  }
  local_a8 = 1;
  local_b4 = 1;
  do {
    if (4 < local_b4) {
      return;
    }
    if ((local_b4 != 4) || (*puVar6 != 1)) {
      puVar8 = v_array<unsigned_int>::operator[](this,(ulong)local_b4);
      uVar10 = *puVar8;
      puVar8 = v_array<unsigned_int>::operator[](this,local_a8);
      if (uVar10 < *puVar8) {
        puVar8 = pvVar4->_begin;
        pvVar9 = (v_array<unsigned_int> *)(ptVar3->valid_actions)._end;
        valid_actions_02._begin._4_4_ = uVar11;
        valid_actions_02._begin._0_4_ = uVar10;
        valid_actions_02._end = in_stack_ffffffffffffff08;
        valid_actions_02.end_array = (uint *)in_stack_ffffffffffffff10;
        valid_actions_02.erase_count = (size_t)in_stack_ffffffffffffff18;
        bVar2 = is_valid((uint64_t)(ptVar3->valid_actions).end_array,valid_actions_02);
        if (bVar2) {
          local_a8 = (size_t)local_b4;
          v_array<unsigned_int>::clear(pvVar9);
          v_array<unsigned_int>::push_back(pvVar9,puVar8);
          goto LAB_003c7ade;
        }
      }
      puVar8 = v_array<unsigned_int>::operator[](this,(ulong)local_b4);
      uVar1 = *puVar8;
      puVar8 = v_array<unsigned_int>::operator[](this,local_a8);
      if (uVar1 == *puVar8) {
        puVar8 = pvVar4->_begin;
        pvVar9 = (v_array<unsigned_int> *)(ptVar3->valid_actions)._end;
        in_stack_ffffffffffffff18 = (ptVar3->valid_actions).end_array;
        valid_actions_03._begin._4_4_ = uVar11;
        valid_actions_03._begin._0_4_ = uVar10;
        valid_actions_03._end = puVar8;
        valid_actions_03.end_array = (uint *)pvVar9;
        valid_actions_03.erase_count = (size_t)in_stack_ffffffffffffff18;
        in_stack_ffffffffffffff08 = puVar8;
        in_stack_ffffffffffffff10 = pvVar9;
        bVar2 = is_valid((uint64_t)in_stack_ffffffffffffff18,valid_actions_03);
        if (bVar2) {
          v_array<unsigned_int>::push_back(pvVar9,puVar8);
        }
      }
    }
LAB_003c7ade:
    local_b4 = local_b4 + 1;
  } while( true );
}

Assistant:

void get_gold_actions(Search::search &sch, uint32_t idx, uint64_t /* n */, v_array<action> &gold_actions)
{
  task_data *data = sch.get_task_data<task_data>();
  v_array<uint32_t> &action_loss = data->action_loss, &stack = data->stack, &gold_heads = data->gold_heads,
                    &valid_actions = data->valid_actions;
  gold_actions.clear();
  size_t size = stack.size();
  size_t last = (size == 0) ? 0 : stack.last();
  uint32_t &sys = data->transition_system;

  if (sys == arc_hybrid && is_valid(SHIFT, valid_actions) && (stack.empty() || gold_heads[idx] == last))
  {
    gold_actions.push_back(SHIFT);
    return;
  }

  if (sys == arc_hybrid && is_valid(REDUCE_LEFT, valid_actions) && gold_heads[last] == idx)
  {
    gold_actions.push_back(REDUCE_LEFT);
    return;
  }
  size_t best_action = 1;
  size_t count = 0;
  for (uint32_t i = 1; i <= 4; i++)
  {
    if (i == 4 && sys == arc_hybrid)
      continue;
    if (action_loss[i] < action_loss[best_action] && is_valid(i, valid_actions))
    {
      best_action = i;
      count = 1;
      gold_actions.clear();
      gold_actions.push_back(i);
    }
    else if (action_loss[i] == action_loss[best_action] && is_valid(i, valid_actions))
    {
      count++;
      gold_actions.push_back(i);
    }
  }
}